

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O2

Type * __thiscall
slang::ast::builtins::ClassRandomizeFunction::checkArguments
          (ClassRandomizeFunction *this,ASTContext *context,Args *args,SourceRange range,
          Expression *thisExpr)

{
  Compilation *pCVar1;
  size_t sVar2;
  Expression *this_00;
  bool bVar3;
  ClassType *pCVar4;
  Symbol *pSVar5;
  long lVar6;
  ulong uVar7;
  long *plVar8;
  pair<const_slang::ast::ClassType_*,_bool> pVar9;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,thisExpr != (Expression *)0x0,args,range,
                     0,0x7fffffff);
  if (bVar3) {
    uVar7 = (ulong)(thisExpr != (Expression *)0x0);
    plVar8 = (long *)((ulong)((uint)(thisExpr != (Expression *)0x0) * 8) + (long)args->_M_ptr);
    sVar2 = (args->_M_extent)._M_extent_value;
    if (sVar2 - uVar7 == 1) {
      bVar3 = Type::isNull(*(Type **)(*plVar8 + 8));
      lVar6 = 0x158;
      if (bVar3) goto LAB_003a1f69;
    }
    if (thisExpr == (Expression *)0x0) {
      pVar9 = Lookup::getContainingClass((context->scope).ptr);
      pCVar4 = pVar9.first;
      if (pCVar4 == (ClassType *)0x0) goto LAB_003a1f59;
    }
    else {
      pCVar4 = (ClassType *)Type::getCanonicalType((thisExpr->type).ptr);
    }
    lVar6 = 0;
    do {
      if (sVar2 * 8 + uVar7 * -8 == lVar6) {
        lVar6 = 0x158;
        goto LAB_003a1f69;
      }
      this_00 = *(Expression **)((long)plVar8 + lVar6);
    } while ((((this_00->kind == NamedValue) &&
              (pSVar5 = Expression::getSymbolReference(this_00,true), pSVar5 != (Symbol *)0x0)) &&
             (pSVar5->kind == ClassProperty)) &&
            (lVar6 = lVar6 + 8, pSVar5->parentScope == &pCVar4->super_Scope));
    ASTContext::addDiag(context,(DiagCode)0x8000b,this_00->sourceRange);
    lVar6 = 400;
  }
  else {
LAB_003a1f59:
    lVar6 = 400;
  }
LAB_003a1f69:
  return *(Type **)((long)&(pCVar1->super_BumpAllocator).head + lVar6);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* thisExpr) const final {
        bool isMethod = thisExpr != nullptr;
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, isMethod, args, range, 0, INT32_MAX))
            return comp.getErrorType();

        Args methodArgs = args;
        if (isMethod)
            methodArgs = methodArgs.subspan(1);

        // Special case: a single 'null' argument can be passed to indicate
        // that no variables should be randomized.
        if (methodArgs.size() == 1 && methodArgs[0]->type->isNull())
            return comp.getIntType();

        // This can only be called via a special lookup on a class handle or as a local
        // class member, so we know either the this expression gives us the class type
        // or we can look it up from our current scope.
        const Scope* ct;
        if (thisExpr)
            ct = &thisExpr->type->getCanonicalType().as<ClassType>();
        else
            ct = Lookup::getContainingClass(*context.scope).first;

        if (!ct)
            return comp.getErrorType();

        for (auto arg : methodArgs) {
            if (arg->kind != ExpressionKind::NamedValue) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }

            auto sym = arg->getSymbolReference();
            if (!sym || sym->kind != SymbolKind::ClassProperty || sym->getParentScope() != ct) {
                context.addDiag(diag::ExpectedClassPropertyName, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }